

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::UpdateBlockAvailability
          (PeerManagerImpl *this,NodeId nodeid,uint256 *hash)

{
  long lVar1;
  bool bVar2;
  BlockManager *this_00;
  CBlockIndex *pCVar3;
  undefined8 *in_RDX;
  PeerManagerImpl *in_RSI;
  PeerManagerImpl *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  CNodeState *state;
  uint7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar4;
  uint256 *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (BlockManager *)
            State(in_RDI,CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  if (this_00 == (BlockManager *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x5ce,
                  "void (anonymous namespace)::PeerManagerImpl::UpdateBlockAvailability(NodeId, const uint256 &)"
                 );
  }
  ProcessBlockAvailability(in_RSI,(NodeId)in_RDX);
  pCVar3 = ::node::BlockManager::LookupBlockIndex(this_00,in_stack_ffffffffffffffb0);
  uVar4 = false;
  if (pCVar3 != (CBlockIndex *)0x0) {
    base_uint<256U>::base_uint((base_uint<256U> *)in_RDI,(ulong)in_stack_ffffffffffffffa0);
    uVar4 = operator>((base_uint<256U> *)in_RDI,
                      (base_uint<256U> *)CONCAT17(uVar4,in_stack_ffffffffffffffa0));
  }
  if ((bool)uVar4 == false) {
    *(undefined8 *)
     ((long)&(this_00->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex
     + 8) = *in_RDX;
    *(undefined8 *)
     ((long)&(this_00->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex
     + 0x10) = in_RDX[1];
    (this_00->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.
    __list.__prev = (__pthread_internal_list *)in_RDX[2];
    (this_00->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.
    __list.__next = (__pthread_internal_list *)in_RDX[3];
  }
  else if (((this_00->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.
            __align == 0) ||
          (bVar2 = operator>=((base_uint<256U> *)in_RDI,
                              (base_uint<256U> *)CONCAT17(uVar4,in_stack_ffffffffffffffa0)), bVar2))
  {
    (this_00->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align
         = (long)pCVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::UpdateBlockAvailability(NodeId nodeid, const uint256 &hash) {
    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    ProcessBlockAvailability(nodeid);

    const CBlockIndex* pindex = m_chainman.m_blockman.LookupBlockIndex(hash);
    if (pindex && pindex->nChainWork > 0) {
        // An actually better block was announced.
        if (state->pindexBestKnownBlock == nullptr || pindex->nChainWork >= state->pindexBestKnownBlock->nChainWork) {
            state->pindexBestKnownBlock = pindex;
        }
    } else {
        // An unknown block was announced; just assume that the latest one is the best one.
        state->hashLastUnknownBlock = hash;
    }
}